

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O2

void embree::avx::splitPrimitive<embree::avx::TriangleSplitter>
               (TriangleSplitter *splitter,PrimRef *prim,uint splitprims,SplittingGrid *grid,
               PrimRef *subPrims,uint *numSubPrims)

{
  PrimRef *pPVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  uint uVar8;
  byte bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  PrimRef left;
  PrimRef right;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_a0;
  undefined1 local_90 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_80;
  undefined1 local_70 [16];
  undefined1 auVar18 [64];
  undefined1 auVar20 [64];
  
  if (splitprims == 1) {
    uVar8 = *numSubPrims;
    *numSubPrims = uVar8 + 1;
    uVar10 = *(undefined8 *)((long)&(prim->lower).field_0 + 8);
    uVar11 = *(undefined8 *)&(prim->upper).field_0;
    uVar12 = *(undefined8 *)((long)&(prim->upper).field_0 + 8);
    pPVar1 = subPrims + uVar8;
    *(undefined8 *)&(pPVar1->lower).field_0 = *(undefined8 *)&(prim->lower).field_0;
    *(undefined8 *)((long)&(pPVar1->lower).field_0 + 8) = uVar10;
    *(undefined8 *)&(pPVar1->upper).field_0 = uVar11;
    *(undefined8 *)((long)&(pPVar1->upper).field_0 + 8) = uVar12;
    return;
  }
  aVar5 = (prim->lower).field_0;
  aVar6 = (prim->upper).field_0;
  aVar7 = (grid->base).field_0;
  auVar17 = vsubps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar7);
  fVar2 = grid->scale;
  auVar21._0_4_ = auVar17._0_4_ * fVar2 + 0.2;
  auVar21._4_4_ = auVar17._4_4_ * fVar2 + 0.2;
  auVar21._8_4_ = auVar17._8_4_ * fVar2 + 0.2;
  auVar21._12_4_ = auVar17._12_4_ * fVar2 + 0.2;
  auVar17 = vsubps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar7);
  auVar30._0_4_ = auVar17._0_4_ * fVar2 + -0.2;
  auVar30._4_4_ = auVar17._4_4_ * fVar2 + -0.2;
  auVar30._8_4_ = auVar17._8_4_ * fVar2 + -0.2;
  auVar30._12_4_ = auVar17._12_4_ * fVar2 + -0.2;
  auVar17 = vroundps_avx(auVar21,1);
  auVar17 = vcvtps2dq_avx(auVar17);
  auVar19 = vroundps_avx(auVar30,1);
  auVar19 = vcvtps2dq_avx(auVar19);
  auVar21 = vcvtps2dq_avx(auVar21);
  auVar30 = vcvtps2dq_avx(auVar30);
  auVar21 = vpcmpgtd_avx(auVar30,auVar21);
  local_a0 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendvps_avx(auVar17,auVar19,auVar21);
  auVar19 = vshufps_avx(auVar17,auVar17,0xe8);
  auVar21 = vpslld_avx(auVar19,0x10);
  auVar19 = vpor_avx(auVar21,auVar19);
  auVar22._8_4_ = 0x30000ff;
  auVar22._0_8_ = 0x30000ff030000ff;
  auVar22._12_4_ = 0x30000ff;
  auVar19 = vpand_avx(auVar19,auVar22);
  auVar23._8_4_ = 0x101;
  auVar23._0_8_ = 0x10100000101;
  auVar23._12_4_ = 0x101;
  auVar19 = vpmulld_avx(auVar19,auVar23);
  auVar25._8_4_ = 0x300f00f;
  auVar25._0_8_ = 0x300f00f0300f00f;
  auVar25._12_4_ = 0x300f00f;
  auVar19 = vpand_avx(auVar19,auVar25);
  auVar27._8_4_ = 0x11;
  auVar27._0_8_ = 0x1100000011;
  auVar27._12_4_ = 0x11;
  auVar19 = vpmulld_avx(auVar19,auVar27);
  auVar29._8_4_ = 0x30c30c3;
  auVar29._0_8_ = 0x30c30c3030c30c3;
  auVar29._12_4_ = 0x30c30c3;
  auVar19 = vpand_avx(auVar29,auVar19);
  auVar19 = vpmulld_avx(auVar19,_DAT_01f820b0);
  auVar19 = vpand_avx(auVar19,_DAT_01f820c0);
  auVar21 = vshufps_avx((undefined1  [16])local_a0,(undefined1  [16])local_a0,0xe9);
  auVar30 = vpslld_avx(auVar21,0x10);
  auVar21 = vpor_avx(auVar30,auVar21);
  auVar21 = vpand_avx(auVar21,auVar22);
  auVar21 = vpmulld_avx(auVar21,auVar23);
  auVar21 = vpand_avx(auVar21,auVar25);
  auVar21 = vpmulld_avx(auVar21,auVar27);
  auVar21 = vpand_avx(auVar21,auVar29);
  auVar21 = vpmulld_avx(auVar21,_DAT_01f820d0);
  auVar21 = vpand_avx(auVar21,_DAT_01f820e0);
  auVar17 = vblendps_avx((undefined1  [16])local_a0,auVar17,2);
  auVar17 = vshufps_avx(auVar17,auVar17,0xe1);
  auVar30 = vpslld_avx(auVar17,0x10);
  auVar17 = vpor_avx(auVar30,auVar17);
  auVar17 = vpand_avx(auVar17,auVar22);
  auVar17 = vpmulld_avx(auVar17,auVar23);
  auVar17 = vpand_avx(auVar17,auVar25);
  auVar17 = vpmulld_avx(auVar17,auVar27);
  auVar17 = vpand_avx(auVar29,auVar17);
  auVar17 = vpmulld_avx(auVar17,_DAT_01f820f0);
  auVar17 = vpand_avx(auVar17,_DAT_01f82100);
  auVar30 = vpunpckldq_avx(auVar19,auVar21);
  auVar30 = vpor_avx(auVar30,auVar17);
  auVar17 = vpshufd_avx(auVar19,0x55);
  auVar17 = vpblendw_avx(auVar17,auVar21,0xc);
  auVar17 = vpor_avx(auVar30,auVar17);
  if (auVar17._0_4_ == auVar17._4_4_) {
    uVar8 = *numSubPrims;
    *numSubPrims = uVar8 + 1;
    uVar10 = *(undefined8 *)((long)&(prim->lower).field_0 + 8);
    uVar11 = *(undefined8 *)&(prim->upper).field_0;
    uVar12 = *(undefined8 *)((long)&(prim->upper).field_0 + 8);
    pPVar1 = subPrims + uVar8;
    *(undefined8 *)&(pPVar1->lower).field_0 = *(undefined8 *)&(prim->lower).field_0;
    *(undefined8 *)((long)&(pPVar1->lower).field_0 + 8) = uVar10;
    *(undefined8 *)&(pPVar1->upper).field_0 = uVar11;
    *(undefined8 *)((long)&(pPVar1->upper).field_0 + 8) = uVar12;
  }
  else {
    uVar13 = auVar17._4_4_ ^ auVar17._0_4_;
    uVar8 = 0x1f;
    if (uVar13 != 0) {
      for (; uVar13 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    bVar9 = (byte)((ulong)uVar8 / 3);
    uVar15 = (ulong)(uVar8 % 3 << 2);
    fVar2 = (float)((*(uint *)((long)&local_a0 + uVar15) >> (bVar9 & 0x1f)) << (bVar9 & 0x1f)) *
            0.0009765625 * grid->extend + *(float *)((long)&(grid->base).field_0 + uVar15);
    lVar14 = 0;
    lVar16 = (ulong)uVar8 * 4 + ((ulong)uVar8 / 3) * -0xc;
    auVar17._8_4_ = 0xff800000;
    auVar17._0_8_ = 0xff800000ff800000;
    auVar17._12_4_ = 0xff800000;
    auVar18 = ZEXT1664(auVar17);
    auVar19._8_4_ = 0x7f800000;
    auVar19._0_8_ = 0x7f8000007f800000;
    auVar19._12_4_ = 0x7f800000;
    auVar20 = ZEXT1664(auVar19);
    auVar24 = ZEXT1664(auVar19);
    auVar26 = ZEXT1664(auVar17);
    while( true ) {
      if (lVar14 == 0x30) break;
      fVar3 = *(float *)((long)splitter + lVar14 + lVar16);
      if (fVar3 <= fVar2) {
        auVar17 = *(undefined1 (*) [16])((long)&splitter->v[0].field_0 + lVar14);
        auVar19 = vminps_avx(auVar24._0_16_,auVar17);
        auVar24 = ZEXT1664(auVar19);
        auVar17 = vmaxps_avx(auVar26._0_16_,auVar17);
        auVar26 = ZEXT1664(auVar17);
      }
      if (fVar2 <= fVar3) {
        auVar17 = *(undefined1 (*) [16])((long)&splitter->v[0].field_0 + lVar14);
        auVar19 = vminps_avx(auVar20._0_16_,auVar17);
        auVar20 = ZEXT1664(auVar19);
        auVar17 = vmaxps_avx(auVar18._0_16_,auVar17);
        auVar18 = ZEXT1664(auVar17);
      }
      fVar4 = *(float *)((long)splitter + lVar14 + lVar16 + 0x10);
      if (((fVar3 < fVar2) && (fVar2 < fVar4)) || ((fVar2 < fVar3 && (fVar4 < fVar2)))) {
        auVar17 = ZEXT416((uint)((fVar2 - fVar3) * (1.0 / (fVar4 - fVar3))));
        auVar19 = vshufps_avx(auVar17,auVar17,0);
        auVar17 = *(undefined1 (*) [16])((long)&splitter->v[0].field_0 + lVar14);
        auVar21 = vsubps_avx(*(undefined1 (*) [16])((long)&splitter->v[1].field_0 + lVar14),auVar17)
        ;
        auVar28._0_4_ = auVar17._0_4_ + auVar19._0_4_ * auVar21._0_4_;
        auVar28._4_4_ = auVar17._4_4_ + auVar19._4_4_ * auVar21._4_4_;
        auVar28._8_4_ = auVar17._8_4_ + auVar19._8_4_ * auVar21._8_4_;
        auVar28._12_4_ = auVar17._12_4_ + auVar19._12_4_ * auVar21._12_4_;
        auVar17 = vminps_avx(auVar24._0_16_,auVar28);
        auVar24 = ZEXT1664(auVar17);
        auVar17 = vmaxps_avx(auVar26._0_16_,auVar28);
        auVar26 = ZEXT1664(auVar17);
        auVar17 = vminps_avx(auVar20._0_16_,auVar28);
        auVar20 = ZEXT1664(auVar17);
        auVar17 = vmaxps_avx(auVar18._0_16_,auVar28);
        auVar18 = ZEXT1664(auVar17);
      }
      lVar14 = lVar14 + 0x10;
    }
    auVar17 = vmaxps_avx(auVar24._0_16_,(undefined1  [16])aVar5);
    auVar19 = vminps_avx(auVar26._0_16_,(undefined1  [16])aVar6);
    local_a0.m128 = (__m128)vblendps_avx(auVar17,aVar5.m128,8);
    local_90 = vblendps_avx(auVar19,(undefined1  [16])aVar6,8);
    auVar17 = vmaxps_avx(auVar20._0_16_,(undefined1  [16])aVar5);
    auVar19 = vminps_avx(auVar18._0_16_,(undefined1  [16])aVar6);
    local_80.m128 = (__m128)vblendps_avx(auVar17,aVar5.m128,8);
    local_70 = vblendps_avx(auVar19,(undefined1  [16])aVar6,8);
    splitPrimitive<embree::avx::TriangleSplitter>
              (splitter,(PrimRef *)&local_a0.field_1,splitprims >> 1,grid,subPrims,numSubPrims);
    splitPrimitive<embree::avx::TriangleSplitter>
              (splitter,(PrimRef *)&local_80.field_1,splitprims - (splitprims >> 1),grid,subPrims,
               numSubPrims);
  }
  return;
}

Assistant:

void splitPrimitive(const Splitter& splitter,
                          const PrimRef& prim,
                          const unsigned int splitprims,
                          const SplittingGrid& grid,
                          PrimRef subPrims[MAX_PRESPLITS_PER_PRIMITIVE],
                          unsigned int& numSubPrims)
    {
      assert(splitprims > 0 && splitprims <= MAX_PRESPLITS_PER_PRIMITIVE);
      
      if (splitprims == 1)
      {
        assert(numSubPrims < MAX_PRESPLITS_PER_PRIMITIVE);
        subPrims[numSubPrims++] = prim;
      }
      else
      {
        unsigned int dim; float fsplit;
        if (!grid.split_pos(prim, dim, fsplit))
        {
          assert(numSubPrims < MAX_PRESPLITS_PER_PRIMITIVE);
          subPrims[numSubPrims++] = prim;
          return;
        }
          
        /* split primitive */
        PrimRef left,right;
        splitter(prim,dim,fsplit,left,right);
        assert(!left.bounds().empty());
        assert(!right.bounds().empty());

        const unsigned int splitprims_left = splitprims/2;
        const unsigned int splitprims_right = splitprims - splitprims_left;
        splitPrimitive(splitter,left,splitprims_left,grid,subPrims,numSubPrims);
        splitPrimitive(splitter,right,splitprims_right,grid,subPrims,numSubPrims);
      }
    }